

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_10.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementTetraCorot_10::ComputeMatrB
          (ChElementTetraCorot_10 *this,ChMatrixDynamic<> *mmatrB,double zeta1,double zeta2,
          double zeta3,double zeta4,double *JacobianDet)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double *pdVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  Scalar SVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  double dVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  double dVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  double dVar51;
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  double dVar59;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  ChMatrixDynamic<> Jacobian;
  DenseStorage<double,__1,__1,__1,_1> local_38;
  
  local_38.m_data = (double *)0x0;
  local_38.m_rows = 0;
  local_38.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_1>::resize(&local_38,0x10,4,4);
  (*(this->super_ChElementTetrahedron)._vptr_ChElementTetrahedron[10])
            (zeta1,zeta2,zeta3,zeta4,this,&local_38);
  SVar28 = Eigen::MatrixBase<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>_>::determinant
                     ((MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)&local_38);
  *JacobianDet = SVar28;
  if ((((2 < local_38.m_rows) && (3 < local_38.m_cols)) && (local_38.m_rows != 3)) &&
     ((uVar19 = (mmatrB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage
                .m_rows, 0 < (long)uVar19 &&
      (uVar20 = (mmatrB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage
                .m_cols, 0 < (long)uVar20)))) {
    auVar29 = ZEXT816(0x4010000000000000);
    auVar24._8_8_ = 0;
    auVar24._0_8_ = zeta1;
    auVar24 = vfmadd231sd_fma(ZEXT816(0xbff0000000000000),auVar29,auVar24);
    pdVar11 = (mmatrB->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
              m_data;
    auVar23._8_8_ = 0;
    auVar23._0_8_ =
         (local_38.m_data[local_38.m_cols * 3 + 3] - local_38.m_data[local_38.m_cols * 3 + 1]) *
         (local_38.m_data[local_38.m_cols * 2 + 2] - local_38.m_data[local_38.m_cols * 2 + 1]);
    auVar52._8_8_ = 0;
    auVar52._0_8_ =
         local_38.m_data[local_38.m_cols * 2 + 3] - local_38.m_data[local_38.m_cols * 2 + 1];
    auVar67._8_8_ = 0;
    auVar67._0_8_ =
         local_38.m_data[local_38.m_cols * 3 + 2] - local_38.m_data[local_38.m_cols * 3 + 1];
    auVar23 = vfmsub231sd_fma(auVar23,auVar52,auVar67);
    dVar31 = auVar24._0_8_;
    *pdVar11 = (dVar31 * auVar23._0_8_) / SVar28;
    if (3 < uVar20) {
      auVar6._8_8_ = 0;
      auVar6._0_8_ = zeta2;
      auVar24 = vfmadd231sd_fma(ZEXT816(0xbff0000000000000),auVar29,auVar6);
      auVar53._8_8_ = 0;
      auVar53._0_8_ =
           local_38.m_data[local_38.m_cols * 2 + 2] - local_38.m_data[local_38.m_cols * 2];
      auVar60._8_8_ = 0;
      auVar60._0_8_ =
           (local_38.m_data[local_38.m_cols * 3] - local_38.m_data[local_38.m_cols * 3 + 2]) *
           (local_38.m_data[local_38.m_cols * 2 + 2] - local_38.m_data[local_38.m_cols * 2 + 3]);
      auVar68._8_8_ = 0;
      auVar68._0_8_ =
           local_38.m_data[local_38.m_cols * 3 + 3] - local_38.m_data[local_38.m_cols * 3 + 2];
      auVar23 = vfmsub231sd_fma(auVar60,auVar68,auVar53);
      dVar43 = auVar24._0_8_;
      pdVar11[3] = (dVar43 * auVar23._0_8_) / SVar28;
      if (6 < uVar20) {
        auVar7._8_8_ = 0;
        auVar7._0_8_ = zeta3;
        auVar24 = vfmadd231sd_fma(ZEXT816(0xbff0000000000000),auVar29,auVar7);
        auVar61._8_8_ = 0;
        auVar61._0_8_ =
             local_38.m_data[local_38.m_cols * 3] - local_38.m_data[local_38.m_cols * 3 + 3];
        auVar69._8_8_ = 0;
        auVar69._0_8_ =
             (local_38.m_data[local_38.m_cols * 2] - local_38.m_data[local_38.m_cols * 2 + 3]) *
             (local_38.m_data[local_38.m_cols * 3 + 1] - local_38.m_data[local_38.m_cols * 3 + 3]);
        auVar95._8_8_ = 0;
        auVar95._0_8_ =
             local_38.m_data[local_38.m_cols * 2 + 1] - local_38.m_data[local_38.m_cols * 2 + 3];
        auVar23 = vfmsub231sd_fma(auVar69,auVar61,auVar95);
        dVar51 = auVar24._0_8_;
        pdVar11[6] = (dVar51 * auVar23._0_8_) / SVar28;
        if (9 < uVar20) {
          auVar8._8_8_ = 0;
          auVar8._0_8_ = zeta4;
          auVar24 = vfmadd231sd_fma(ZEXT816(0xbff0000000000000),auVar29,auVar8);
          auVar29._8_8_ = 0;
          auVar29._0_8_ =
               (local_38.m_data[local_38.m_cols * 2] - local_38.m_data[local_38.m_cols * 2 + 1]) *
               (local_38.m_data[local_38.m_cols * 3 + 2] - local_38.m_data[local_38.m_cols * 3]);
          auVar96._8_8_ = 0;
          auVar96._0_8_ =
               local_38.m_data[local_38.m_cols * 2] - local_38.m_data[local_38.m_cols * 2 + 2];
          auVar145._8_8_ = 0;
          auVar145._0_8_ =
               local_38.m_data[local_38.m_cols * 3 + 1] - local_38.m_data[local_38.m_cols * 3];
          auVar23 = vfmsub231sd_fma(auVar29,auVar145,auVar96);
          dVar59 = auVar24._0_8_;
          pdVar11[9] = (dVar59 * auVar23._0_8_) / SVar28;
          if (0xc < uVar20) {
            dVar2 = local_38.m_data[local_38.m_cols * 2 + 2];
            dVar3 = local_38.m_data[local_38.m_cols * 3 + 2];
            auVar136._8_8_ = 0;
            auVar136._0_8_ = dVar3;
            auVar181._8_8_ = 0;
            auVar181._0_8_ = local_38.m_data[local_38.m_cols * 3 + 3];
            auVar23 = vsubsd_avx512f(auVar181,auVar136);
            auVar70._8_8_ = 0;
            auVar70._0_8_ =
                 local_38.m_data[local_38.m_cols * 2 + 3] - local_38.m_data[local_38.m_cols * 2 + 1]
            ;
            auVar119._8_8_ = 0;
            auVar119._0_8_ =
                 (local_38.m_data[local_38.m_cols * 3 + 3] -
                 local_38.m_data[local_38.m_cols * 3 + 1]) *
                 (dVar2 - local_38.m_data[local_38.m_cols * 2 + 1]);
            auVar160._8_8_ = 0;
            auVar160._0_8_ = dVar3 - local_38.m_data[local_38.m_cols * 3 + 1];
            auVar24 = vfmsub231sd_fma(auVar119,auVar160,auVar70);
            auVar97._8_8_ = 0;
            auVar97._0_8_ =
                 (local_38.m_data[local_38.m_cols * 3] - dVar3) *
                 (dVar2 - local_38.m_data[local_38.m_cols * 2 + 3]);
            auVar175._8_8_ = 0;
            auVar175._0_8_ = dVar2 - local_38.m_data[local_38.m_cols * 2];
            auVar23 = vfmsub231sd_avx512f(auVar97,auVar175,auVar23);
            auVar189._8_8_ = 0;
            auVar189._0_8_ = zeta2;
            auVar24 = vmulsd_avx512f(auVar24,auVar189);
            auVar9._8_8_ = 0;
            auVar9._0_8_ = zeta1;
            auVar24 = vfmadd231sd_fma(auVar24,auVar23,auVar9);
            pdVar11[0xc] = (auVar24._0_8_ * 4.0) / SVar28;
            if (0xf < uVar20) {
              dVar2 = local_38.m_data[local_38.m_cols * 2 + 3];
              dVar3 = local_38.m_data[local_38.m_cols * 3 + 3];
              auVar137._8_8_ = 0;
              auVar137._0_8_ = dVar3;
              auVar176._8_8_ = 0;
              auVar176._0_8_ = local_38.m_data[local_38.m_cols * 3];
              auVar24 = vsubsd_avx512f(auVar176,auVar137);
              auVar98._8_8_ = 0;
              auVar98._0_8_ =
                   (local_38.m_data[local_38.m_cols * 3 + 1] - dVar3) *
                   (local_38.m_data[local_38.m_cols * 2] - dVar2);
              auVar168._8_8_ = 0;
              auVar168._0_8_ = local_38.m_data[local_38.m_cols * 2 + 1] - dVar2;
              auVar23 = vfmsub231sd_avx512f(auVar98,auVar168,auVar24);
              auVar71._8_8_ = 0;
              auVar71._0_8_ =
                   local_38.m_data[local_38.m_cols * 2 + 2] - local_38.m_data[local_38.m_cols * 2];
              auVar120._8_8_ = 0;
              auVar120._0_8_ =
                   (local_38.m_data[local_38.m_cols * 3] - local_38.m_data[local_38.m_cols * 3 + 2])
                   * (local_38.m_data[local_38.m_cols * 2 + 2] - dVar2);
              auVar154._8_8_ = 0;
              auVar154._0_8_ = dVar3 - local_38.m_data[local_38.m_cols * 3 + 2];
              auVar24 = vfmsub231sd_fma(auVar120,auVar154,auVar71);
              auVar184._8_8_ = 0;
              auVar184._0_8_ = zeta3;
              auVar24 = vmulsd_avx512f(auVar24,auVar184);
              auVar24 = vfmadd231sd_avx512f(auVar24,auVar189,auVar23);
              pdVar11[0xf] = (auVar24._0_8_ * 4.0) / SVar28;
              if (0x12 < uVar20) {
                dVar2 = local_38.m_data[local_38.m_cols * 2 + 3];
                dVar3 = local_38.m_data[local_38.m_cols * 2 + 1];
                dVar4 = local_38.m_data[local_38.m_cols * 3 + 3];
                dVar5 = local_38.m_data[local_38.m_cols * 3 + 1];
                auVar72._8_8_ = 0;
                auVar72._0_8_ = dVar2 - dVar3;
                auVar121._8_8_ = 0;
                auVar121._0_8_ =
                     (dVar4 - dVar5) * (local_38.m_data[local_38.m_cols * 2 + 2] - dVar3);
                auVar169._8_8_ = 0;
                auVar169._0_8_ = local_38.m_data[local_38.m_cols * 3 + 2] - dVar5;
                auVar24 = vfmsub231sd_fma(auVar121,auVar72,auVar169);
                auVar73._8_8_ = 0;
                auVar73._0_8_ = (dVar5 - dVar4) * (local_38.m_data[local_38.m_cols * 2] - dVar2);
                auVar146._8_8_ = 0;
                auVar146._0_8_ = local_38.m_data[local_38.m_cols * 3] - dVar4;
                auVar161._8_8_ = 0;
                auVar161._0_8_ = dVar3 - dVar2;
                auVar23 = vfmsub231sd_fma(auVar73,auVar146,auVar161);
                auVar193._8_8_ = 0;
                auVar193._0_8_ = zeta1;
                auVar23 = vmulsd_avx512f(auVar23,auVar193);
                auVar24 = vfmadd231sd_avx512f(auVar23,auVar184,auVar24);
                pdVar11[0x12] = (auVar24._0_8_ * 4.0) / SVar28;
                if (0x15 < uVar20) {
                  dVar2 = local_38.m_data[local_38.m_cols * 3 + 1];
                  auVar170._8_8_ = 0;
                  auVar170._0_8_ = dVar2;
                  dVar3 = local_38.m_data[local_38.m_cols * 2 + 1];
                  auVar162._8_8_ = 0;
                  auVar162._0_8_ = local_38.m_data[local_38.m_cols * 3];
                  auVar23 = vsubsd_avx512f(auVar170,auVar162);
                  auVar74._8_8_ = 0;
                  auVar74._0_8_ =
                       (local_38.m_data[local_38.m_cols * 2 + 2] - dVar3) *
                       (local_38.m_data[local_38.m_cols * 3 + 3] - dVar2);
                  auVar177._8_8_ = 0;
                  auVar177._0_8_ = local_38.m_data[local_38.m_cols * 3 + 2] - dVar2;
                  auVar182._8_8_ = 0;
                  auVar182._0_8_ = local_38.m_data[local_38.m_cols * 2 + 3] - dVar3;
                  auVar24 = vfmsub231sd_fma(auVar74,auVar177,auVar182);
                  auVar99._8_8_ = 0;
                  auVar99._0_8_ =
                       local_38.m_data[local_38.m_cols * 2] -
                       local_38.m_data[local_38.m_cols * 2 + 2];
                  auVar122._8_8_ = 0;
                  auVar122._0_8_ =
                       (local_38.m_data[local_38.m_cols * 3 + 2] -
                       local_38.m_data[local_38.m_cols * 3]) *
                       (local_38.m_data[local_38.m_cols * 2] - dVar3);
                  auVar23 = vfmsub231sd_avx512f(auVar122,auVar99,auVar23);
                  auVar190._8_8_ = 0;
                  auVar190._0_8_ = zeta4;
                  auVar24 = vmulsd_avx512f(auVar24,auVar190);
                  auVar24 = vfmadd231sd_avx512f(auVar24,auVar193,auVar23);
                  pdVar11[0x15] = (auVar24._0_8_ * 4.0) / SVar28;
                  if (0x18 < uVar20) {
                    dVar2 = local_38.m_data[local_38.m_cols * 2 + 2];
                    dVar3 = local_38.m_data[local_38.m_cols * 2];
                    dVar4 = local_38.m_data[local_38.m_cols * 3 + 2];
                    dVar5 = local_38.m_data[local_38.m_cols * 3];
                    auVar75._8_8_ = 0;
                    auVar75._0_8_ =
                         (dVar4 - dVar5) * (dVar3 - local_38.m_data[local_38.m_cols * 2 + 1]);
                    auVar100._8_8_ = 0;
                    auVar100._0_8_ = dVar3 - dVar2;
                    auVar171._8_8_ = 0;
                    auVar171._0_8_ = local_38.m_data[local_38.m_cols * 3 + 1] - dVar5;
                    auVar24 = vfmsub231sd_fma(auVar75,auVar100,auVar171);
                    auVar101._8_8_ = 0;
                    auVar101._0_8_ =
                         (dVar2 - local_38.m_data[local_38.m_cols * 2 + 3]) * (dVar5 - dVar4);
                    auVar138._8_8_ = 0;
                    auVar138._0_8_ = local_38.m_data[local_38.m_cols * 3 + 3] - dVar4;
                    auVar155._8_8_ = 0;
                    auVar155._0_8_ = dVar2 - dVar3;
                    auVar23 = vfmsub231sd_fma(auVar101,auVar138,auVar155);
                    auVar23 = vmulsd_avx512f(auVar23,auVar190);
                    auVar10._8_8_ = 0;
                    auVar10._0_8_ = zeta2;
                    auVar24 = vfmadd231sd_fma(auVar23,auVar24,auVar10);
                    pdVar11[0x18] = (auVar24._0_8_ * 4.0) / SVar28;
                    if (0x1b < uVar20) {
                      dVar2 = local_38.m_data[local_38.m_cols * 2];
                      dVar3 = local_38.m_data[local_38.m_cols * 3];
                      auVar156._8_8_ = 0;
                      auVar156._0_8_ = dVar3;
                      auVar185._8_8_ = 0;
                      auVar185._0_8_ = local_38.m_data[local_38.m_cols * 3 + 2];
                      auVar23 = vsubsd_avx512f(auVar185,auVar156);
                      auVar76._8_8_ = 0;
                      auVar76._0_8_ =
                           local_38.m_data[local_38.m_cols * 2 + 1] -
                           local_38.m_data[local_38.m_cols * 2 + 3];
                      auVar123._8_8_ = 0;
                      auVar123._0_8_ =
                           (local_38.m_data[local_38.m_cols * 3 + 1] -
                           local_38.m_data[local_38.m_cols * 3 + 3]) *
                           (dVar2 - local_38.m_data[local_38.m_cols * 2 + 3]);
                      auVar172._8_8_ = 0;
                      auVar172._0_8_ = dVar3 - local_38.m_data[local_38.m_cols * 3 + 3];
                      auVar24 = vfmsub231sd_fma(auVar123,auVar172,auVar76);
                      auVar102._8_8_ = 0;
                      auVar102._0_8_ =
                           auVar23._0_8_ * (dVar2 - local_38.m_data[local_38.m_cols * 2 + 1]);
                      auVar178._8_8_ = 0;
                      auVar178._0_8_ = dVar2 - local_38.m_data[local_38.m_cols * 2 + 2];
                      auVar183._8_8_ = 0;
                      auVar183._0_8_ = local_38.m_data[local_38.m_cols * 3 + 1] - dVar3;
                      auVar23 = vfmsub231sd_fma(auVar102,auVar178,auVar183);
                      auVar191._8_8_ = 0;
                      auVar191._0_8_ = zeta4;
                      auVar24 = vmulsd_avx512f(auVar24,auVar191);
                      auVar186._8_8_ = 0;
                      auVar186._0_8_ = zeta3;
                      auVar24 = vfmadd231sd_avx512f(auVar24,auVar186,auVar23);
                      pdVar11[0x1b] = (auVar24._0_8_ * 4.0) / SVar28;
                      if (uVar19 != 1) {
                        auVar77._8_8_ = 0;
                        auVar77._0_8_ =
                             (local_38.m_data[local_38.m_cols + 3] -
                             local_38.m_data[local_38.m_cols + 1]) *
                             (local_38.m_data[local_38.m_cols * 3 + 2] -
                             local_38.m_data[local_38.m_cols * 3 + 1]);
                        auVar139._8_8_ = 0;
                        auVar139._0_8_ =
                             local_38.m_data[local_38.m_cols + 2] -
                             local_38.m_data[local_38.m_cols + 1];
                        auVar157._8_8_ = 0;
                        auVar157._0_8_ =
                             local_38.m_data[local_38.m_cols * 3 + 3] -
                             local_38.m_data[local_38.m_cols * 3 + 1];
                        auVar24 = vfmsub231sd_fma(auVar77,auVar157,auVar139);
                        pdVar11[uVar20 + 1] = (dVar31 * auVar24._0_8_) / SVar28;
                        auVar78._8_8_ = 0;
                        auVar78._0_8_ =
                             local_38.m_data[local_38.m_cols + 3] -
                             local_38.m_data[local_38.m_cols + 2];
                        auVar103._8_8_ = 0;
                        auVar103._0_8_ =
                             (local_38.m_data[local_38.m_cols * 3 + 2] -
                             local_38.m_data[local_38.m_cols * 3 + 3]) *
                             (local_38.m_data[local_38.m_cols] -
                             local_38.m_data[local_38.m_cols + 2]);
                        auVar147._8_8_ = 0;
                        auVar147._0_8_ =
                             local_38.m_data[local_38.m_cols * 3 + 2] -
                             local_38.m_data[local_38.m_cols * 3];
                        auVar24 = vfmsub231sd_fma(auVar103,auVar78,auVar147);
                        pdVar11[uVar20 + 4] = (dVar43 * auVar24._0_8_) / SVar28;
                        auVar79._8_8_ = 0;
                        auVar79._0_8_ =
                             (local_38.m_data[local_38.m_cols * 3] -
                             local_38.m_data[local_38.m_cols * 3 + 3]) *
                             (local_38.m_data[local_38.m_cols + 1] -
                             local_38.m_data[local_38.m_cols + 3]);
                        auVar104._8_8_ = 0;
                        auVar104._0_8_ =
                             local_38.m_data[local_38.m_cols] - local_38.m_data[local_38.m_cols + 3]
                        ;
                        auVar148._8_8_ = 0;
                        auVar148._0_8_ =
                             local_38.m_data[local_38.m_cols * 3 + 1] -
                             local_38.m_data[local_38.m_cols * 3 + 3];
                        auVar24 = vfmsub231sd_fma(auVar79,auVar104,auVar148);
                        pdVar11[uVar20 + 7] = (dVar51 * auVar24._0_8_) / SVar28;
                        auVar80._8_8_ = 0;
                        auVar80._0_8_ =
                             (local_38.m_data[local_38.m_cols * 3] -
                             local_38.m_data[local_38.m_cols * 3 + 1]) *
                             (local_38.m_data[local_38.m_cols + 2] -
                             local_38.m_data[local_38.m_cols]);
                        auVar105._8_8_ = 0;
                        auVar105._0_8_ =
                             local_38.m_data[local_38.m_cols + 1] - local_38.m_data[local_38.m_cols]
                        ;
                        auVar140._8_8_ = 0;
                        auVar140._0_8_ =
                             local_38.m_data[local_38.m_cols * 3] -
                             local_38.m_data[local_38.m_cols * 3 + 2];
                        auVar24 = vfmsub231sd_fma(auVar80,auVar105,auVar140);
                        pdVar11[uVar20 + 10] = (dVar59 * auVar24._0_8_) / SVar28;
                        dVar2 = local_38.m_data[local_38.m_cols * 3 + 2];
                        dVar3 = local_38.m_data[local_38.m_cols + 2];
                        auVar124._8_8_ = 0;
                        auVar124._0_8_ = local_38.m_data[local_38.m_cols + 3] - dVar3;
                        auVar158._8_8_ = 0;
                        auVar158._0_8_ = dVar2 - local_38.m_data[local_38.m_cols * 3];
                        auVar163._8_8_ = 0;
                        auVar163._0_8_ =
                             (dVar2 - local_38.m_data[local_38.m_cols * 3 + 3]) *
                             (local_38.m_data[local_38.m_cols] - dVar3);
                        auVar24 = vfmsub231sd_fma(auVar163,auVar124,auVar158);
                        auVar81._8_8_ = 0;
                        auVar81._0_8_ =
                             (dVar2 - local_38.m_data[local_38.m_cols * 3 + 1]) *
                             (local_38.m_data[local_38.m_cols + 3] -
                             local_38.m_data[local_38.m_cols + 1]);
                        auVar106._8_8_ = 0;
                        auVar106._0_8_ = dVar3 - local_38.m_data[local_38.m_cols + 1];
                        auVar125._8_8_ = 0;
                        auVar125._0_8_ =
                             local_38.m_data[local_38.m_cols * 3 + 3] -
                             local_38.m_data[local_38.m_cols * 3 + 1];
                        auVar23 = vfmsub231sd_fma(auVar81,auVar106,auVar125);
                        auVar194._8_8_ = 0;
                        auVar194._0_8_ = zeta2;
                        auVar23 = vmulsd_avx512f(auVar23,auVar194);
                        auVar196._8_8_ = 0;
                        auVar196._0_8_ = zeta1;
                        auVar24 = vfmadd231sd_avx512f(auVar23,auVar196,auVar24);
                        pdVar11[uVar20 + 0xd] = (auVar24._0_8_ * 4.0) / SVar28;
                        dVar2 = local_38.m_data[local_38.m_cols + 3];
                        dVar3 = local_38.m_data[local_38.m_cols * 3 + 3];
                        auVar126._8_8_ = 0;
                        auVar126._0_8_ =
                             (local_38.m_data[local_38.m_cols * 3] - dVar3) *
                             (local_38.m_data[local_38.m_cols + 1] - dVar2);
                        auVar141._8_8_ = 0;
                        auVar141._0_8_ = local_38.m_data[local_38.m_cols] - dVar2;
                        auVar159._8_8_ = 0;
                        auVar159._0_8_ = local_38.m_data[local_38.m_cols * 3 + 1] - dVar3;
                        auVar24 = vfmsub231sd_fma(auVar126,auVar141,auVar159);
                        auVar82._8_8_ = 0;
                        auVar82._0_8_ = dVar2 - local_38.m_data[local_38.m_cols + 2];
                        auVar107._8_8_ = 0;
                        auVar107._0_8_ =
                             (local_38.m_data[local_38.m_cols * 3 + 2] - dVar3) *
                             (local_38.m_data[local_38.m_cols] -
                             local_38.m_data[local_38.m_cols + 2]);
                        auVar149._8_8_ = 0;
                        auVar149._0_8_ =
                             local_38.m_data[local_38.m_cols * 3 + 2] -
                             local_38.m_data[local_38.m_cols * 3];
                        auVar23 = vfmsub231sd_fma(auVar107,auVar82,auVar149);
                        auVar23 = vmulsd_avx512f(auVar23,auVar186);
                        auVar24 = vfmadd231sd_avx512f(auVar23,auVar194,auVar24);
                        pdVar11[uVar20 + 0x10] = (auVar24._0_8_ * 4.0) / SVar28;
                        dVar2 = local_38.m_data[local_38.m_cols + 1];
                        dVar3 = local_38.m_data[local_38.m_cols + 3];
                        dVar4 = local_38.m_data[local_38.m_cols * 3 + 1];
                        dVar5 = local_38.m_data[local_38.m_cols * 3 + 3];
                        auVar83._8_8_ = 0;
                        auVar83._0_8_ = local_38.m_data[local_38.m_cols + 2] - dVar2;
                        auVar164._8_8_ = 0;
                        auVar164._0_8_ = dVar5 - dVar4;
                        auVar179._8_8_ = 0;
                        auVar179._0_8_ =
                             (local_38.m_data[local_38.m_cols * 3 + 2] - dVar4) * (dVar3 - dVar2);
                        auVar24 = vfmsub231sd_fma(auVar179,auVar83,auVar164);
                        auVar84._8_8_ = 0;
                        auVar84._0_8_ = local_38.m_data[local_38.m_cols] - dVar3;
                        auVar108._8_8_ = 0;
                        auVar108._0_8_ = dVar4 - dVar5;
                        auVar127._8_8_ = 0;
                        auVar127._0_8_ =
                             (local_38.m_data[local_38.m_cols * 3] - dVar5) * (dVar2 - dVar3);
                        auVar23 = vfmsub231sd_fma(auVar127,auVar84,auVar108);
                        auVar23 = vmulsd_avx512f(auVar23,auVar196);
                        auVar187._8_8_ = 0;
                        auVar187._0_8_ = zeta3;
                        auVar24 = vfmadd231sd_avx512f(auVar23,auVar187,auVar24);
                        pdVar11[uVar20 + 0x13] = (auVar24._0_8_ * 4.0) / SVar28;
                        dVar2 = local_38.m_data[local_38.m_cols + 1];
                        dVar3 = local_38.m_data[local_38.m_cols * 3 + 1];
                        auVar85._8_8_ = 0;
                        auVar85._0_8_ =
                             (local_38.m_data[local_38.m_cols * 3] - dVar3) *
                             (local_38.m_data[local_38.m_cols + 2] -
                             local_38.m_data[local_38.m_cols]);
                        auVar128._8_8_ = 0;
                        auVar128._0_8_ = dVar2 - local_38.m_data[local_38.m_cols];
                        auVar165._8_8_ = 0;
                        auVar165._0_8_ =
                             local_38.m_data[local_38.m_cols * 3] -
                             local_38.m_data[local_38.m_cols * 3 + 2];
                        auVar24 = vfmsub231sd_fma(auVar85,auVar128,auVar165);
                        auVar109._8_8_ = 0;
                        auVar109._0_8_ =
                             (local_38.m_data[local_38.m_cols * 3 + 2] - dVar3) *
                             (local_38.m_data[local_38.m_cols + 3] - dVar2);
                        auVar129._8_8_ = 0;
                        auVar129._0_8_ = local_38.m_data[local_38.m_cols + 2] - dVar2;
                        auVar150._8_8_ = 0;
                        auVar150._0_8_ = local_38.m_data[local_38.m_cols * 3 + 3] - dVar3;
                        auVar23 = vfmsub231sd_fma(auVar109,auVar129,auVar150);
                        auVar23 = vmulsd_avx512f(auVar23,auVar191);
                        auVar197._8_8_ = 0;
                        auVar197._0_8_ = zeta1;
                        auVar24 = vfmadd231sd_avx512f(auVar23,auVar197,auVar24);
                        pdVar11[uVar20 + 0x16] = (auVar24._0_8_ * 4.0) / SVar28;
                        dVar2 = local_38.m_data[local_38.m_cols * 3];
                        dVar3 = local_38.m_data[local_38.m_cols];
                        dVar4 = local_38.m_data[local_38.m_cols + 2];
                        dVar5 = local_38.m_data[local_38.m_cols * 3 + 2];
                        auVar110._8_8_ = 0;
                        auVar110._0_8_ = local_38.m_data[local_38.m_cols + 1] - dVar3;
                        auVar151._8_8_ = 0;
                        auVar151._0_8_ = dVar2 - dVar5;
                        auVar166._8_8_ = 0;
                        auVar166._0_8_ =
                             (dVar2 - local_38.m_data[local_38.m_cols * 3 + 1]) * (dVar4 - dVar3);
                        auVar24 = vfmsub231sd_fma(auVar166,auVar110,auVar151);
                        auVar86._8_8_ = 0;
                        auVar86._0_8_ =
                             (dVar5 - local_38.m_data[local_38.m_cols * 3 + 3]) * (dVar3 - dVar4);
                        auVar111._8_8_ = 0;
                        auVar111._0_8_ = local_38.m_data[local_38.m_cols + 3] - dVar4;
                        auVar130._8_8_ = 0;
                        auVar130._0_8_ = dVar5 - dVar2;
                        auVar23 = vfmsub231sd_fma(auVar86,auVar111,auVar130);
                        auVar23 = vmulsd_avx512f(auVar23,auVar191);
                        auVar195._8_8_ = 0;
                        auVar195._0_8_ = zeta2;
                        auVar24 = vfmadd231sd_avx512f(auVar23,auVar195,auVar24);
                        pdVar11[uVar20 + 0x19] = (auVar24._0_8_ * 4.0) / SVar28;
                        if (uVar20 != 0x1c) {
                          dVar2 = local_38.m_data[local_38.m_cols * 3];
                          dVar3 = local_38.m_data[local_38.m_cols];
                          auVar87._8_8_ = 0;
                          auVar87._0_8_ =
                               (dVar2 - local_38.m_data[local_38.m_cols * 3 + 1]) *
                               (local_38.m_data[local_38.m_cols + 2] - dVar3);
                          auVar112._8_8_ = 0;
                          auVar112._0_8_ = local_38.m_data[local_38.m_cols + 1] - dVar3;
                          auVar180._8_8_ = 0;
                          auVar180._0_8_ = dVar2 - local_38.m_data[local_38.m_cols * 3 + 2];
                          auVar24 = vfmsub231sd_fma(auVar87,auVar112,auVar180);
                          auVar113._8_8_ = 0;
                          auVar113._0_8_ =
                               (local_38.m_data[local_38.m_cols + 1] -
                               local_38.m_data[local_38.m_cols + 3]) *
                               (dVar2 - local_38.m_data[local_38.m_cols * 3 + 3]);
                          auVar131._8_8_ = 0;
                          auVar131._0_8_ = dVar3 - local_38.m_data[local_38.m_cols + 3];
                          auVar173._8_8_ = 0;
                          auVar173._0_8_ =
                               local_38.m_data[local_38.m_cols * 3 + 1] -
                               local_38.m_data[local_38.m_cols * 3 + 3];
                          auVar23 = vfmsub231sd_fma(auVar113,auVar173,auVar131);
                          auVar23 = vmulsd_avx512f(auVar23,auVar191);
                          auVar24 = vfmadd231sd_avx512f(auVar23,auVar187,auVar24);
                          pdVar11[uVar20 + 0x1c] = (auVar24._0_8_ * 4.0) / SVar28;
                          if (2 < uVar19) {
                            auVar167._8_8_ = 0;
                            auVar167._0_8_ = zeta2;
                            auVar174._8_8_ = 0;
                            auVar174._0_8_ = zeta1;
                            auVar88._8_8_ = 0;
                            auVar88._0_8_ =
                                 (local_38.m_data[local_38.m_cols + 2] -
                                 local_38.m_data[local_38.m_cols + 1]) *
                                 (local_38.m_data[local_38.m_cols * 2 + 3] -
                                 local_38.m_data[local_38.m_cols * 2 + 1]);
                            auVar114._8_8_ = 0;
                            auVar114._0_8_ =
                                 local_38.m_data[local_38.m_cols + 3] -
                                 local_38.m_data[local_38.m_cols + 1];
                            auVar152._8_8_ = 0;
                            auVar152._0_8_ =
                                 local_38.m_data[local_38.m_cols * 2 + 2] -
                                 local_38.m_data[local_38.m_cols * 2 + 1];
                            auVar24 = vfmsub231sd_fma(auVar88,auVar152,auVar114);
                            pdVar11[uVar20 * 2 + 2] = (dVar31 * auVar24._0_8_) / SVar28;
                            auVar32._8_8_ = 0;
                            auVar32._0_8_ =
                                 (local_38.m_data[local_38.m_cols * 2] -
                                 local_38.m_data[local_38.m_cols * 2 + 2]) *
                                 (local_38.m_data[local_38.m_cols + 2] -
                                 local_38.m_data[local_38.m_cols + 3]);
                            auVar89._8_8_ = 0;
                            auVar89._0_8_ =
                                 local_38.m_data[local_38.m_cols + 2] -
                                 local_38.m_data[local_38.m_cols];
                            auVar115._8_8_ = 0;
                            auVar115._0_8_ =
                                 local_38.m_data[local_38.m_cols * 2 + 3] -
                                 local_38.m_data[local_38.m_cols * 2 + 2];
                            auVar24 = vfmsub231sd_fma(auVar32,auVar89,auVar115);
                            pdVar11[uVar20 * 2 + 5] = (dVar43 * auVar24._0_8_) / SVar28;
                            auVar33._8_8_ = 0;
                            auVar33._0_8_ =
                                 (local_38.m_data[local_38.m_cols * 2 + 1] -
                                 local_38.m_data[local_38.m_cols * 2 + 3]) *
                                 (local_38.m_data[local_38.m_cols] -
                                 local_38.m_data[local_38.m_cols + 3]);
                            auVar44._8_8_ = 0;
                            auVar44._0_8_ =
                                 local_38.m_data[local_38.m_cols + 1] -
                                 local_38.m_data[local_38.m_cols + 3];
                            auVar132._8_8_ = 0;
                            auVar132._0_8_ =
                                 local_38.m_data[local_38.m_cols * 2] -
                                 local_38.m_data[local_38.m_cols * 2 + 3];
                            auVar24 = vfmsub231sd_fma(auVar33,auVar44,auVar132);
                            pdVar11[uVar20 * 2 + 8] = (dVar51 * auVar24._0_8_) / SVar28;
                            auVar34._8_8_ = 0;
                            auVar34._0_8_ =
                                 (local_38.m_data[local_38.m_cols * 2 + 2] -
                                 local_38.m_data[local_38.m_cols * 2]) *
                                 (local_38.m_data[local_38.m_cols] -
                                 local_38.m_data[local_38.m_cols + 1]);
                            auVar45._8_8_ = 0;
                            auVar45._0_8_ =
                                 local_38.m_data[local_38.m_cols] -
                                 local_38.m_data[local_38.m_cols + 2];
                            auVar90._8_8_ = 0;
                            auVar90._0_8_ =
                                 local_38.m_data[local_38.m_cols * 2 + 1] -
                                 local_38.m_data[local_38.m_cols * 2];
                            auVar24 = vfmsub231sd_fma(auVar34,auVar45,auVar90);
                            pdVar11[uVar20 * 2 + 0xb] = (dVar59 * auVar24._0_8_) / SVar28;
                            dVar31 = local_38.m_data[local_38.m_cols + 2];
                            dVar43 = local_38.m_data[local_38.m_cols * 2 + 2];
                            auVar54._8_8_ = 0;
                            auVar54._0_8_ = dVar31 - local_38.m_data[local_38.m_cols];
                            auVar116._8_8_ = 0;
                            auVar116._0_8_ = local_38.m_data[local_38.m_cols * 2 + 3] - dVar43;
                            auVar142._8_8_ = 0;
                            auVar142._0_8_ =
                                 (local_38.m_data[local_38.m_cols * 2] - dVar43) *
                                 (dVar31 - local_38.m_data[local_38.m_cols + 3]);
                            auVar24 = vfmsub231sd_fma(auVar142,auVar54,auVar116);
                            auVar35._8_8_ = 0;
                            auVar35._0_8_ =
                                 (local_38.m_data[local_38.m_cols * 2 + 3] -
                                 local_38.m_data[local_38.m_cols * 2 + 1]) *
                                 (dVar31 - local_38.m_data[local_38.m_cols + 1]);
                            auVar55._8_8_ = 0;
                            auVar55._0_8_ =
                                 local_38.m_data[local_38.m_cols + 3] -
                                 local_38.m_data[local_38.m_cols + 1];
                            auVar91._8_8_ = 0;
                            auVar91._0_8_ = dVar43 - local_38.m_data[local_38.m_cols * 2 + 1];
                            auVar23 = vfmsub231sd_fma(auVar35,auVar55,auVar91);
                            auVar36._8_8_ = 0;
                            auVar36._0_8_ = zeta2 * auVar23._0_8_;
                            auVar24 = vfmadd231sd_fma(auVar36,auVar174,auVar24);
                            pdVar11[uVar20 * 2 + 0xe] = (auVar24._0_8_ * 4.0) / SVar28;
                            dVar31 = local_38.m_data[local_38.m_cols + 3];
                            dVar43 = local_38.m_data[local_38.m_cols * 2 + 3];
                            auVar46._8_8_ = 0;
                            auVar46._0_8_ = local_38.m_data[local_38.m_cols + 1] - dVar31;
                            auVar117._8_8_ = 0;
                            auVar117._0_8_ =
                                 (local_38.m_data[local_38.m_cols] - dVar31) *
                                 (local_38.m_data[local_38.m_cols * 2 + 1] - dVar43);
                            auVar133._8_8_ = 0;
                            auVar133._0_8_ = local_38.m_data[local_38.m_cols * 2] - dVar43;
                            auVar24 = vfmsub231sd_fma(auVar117,auVar46,auVar133);
                            auVar37._8_8_ = 0;
                            auVar37._0_8_ =
                                 local_38.m_data[local_38.m_cols + 2] -
                                 local_38.m_data[local_38.m_cols];
                            auVar47._8_8_ = 0;
                            auVar47._0_8_ =
                                 (local_38.m_data[local_38.m_cols * 2] -
                                 local_38.m_data[local_38.m_cols * 2 + 2]) *
                                 (local_38.m_data[local_38.m_cols + 2] - dVar31);
                            auVar62._8_8_ = 0;
                            auVar62._0_8_ = dVar43 - local_38.m_data[local_38.m_cols * 2 + 2];
                            auVar23 = vfmsub231sd_fma(auVar47,auVar37,auVar62);
                            auVar23 = vmulsd_avx512f(auVar23,auVar187);
                            auVar24 = vfmadd231sd_fma(auVar23,auVar167,auVar24);
                            pdVar11[uVar20 * 2 + 0x11] = (auVar24._0_8_ * 4.0) / SVar28;
                            dVar31 = local_38.m_data[local_38.m_cols + 1];
                            dVar43 = local_38.m_data[local_38.m_cols * 2 + 1];
                            dVar51 = local_38.m_data[local_38.m_cols * 2 + 3];
                            dVar59 = local_38.m_data[local_38.m_cols + 3];
                            auVar63._8_8_ = 0;
                            auVar63._0_8_ = dVar59 - dVar31;
                            auVar92._8_8_ = 0;
                            auVar92._0_8_ = local_38.m_data[local_38.m_cols * 2 + 2] - dVar43;
                            auVar143._8_8_ = 0;
                            auVar143._0_8_ =
                                 (dVar51 - dVar43) * (local_38.m_data[local_38.m_cols + 2] - dVar31)
                            ;
                            auVar24 = vfmsub231sd_fma(auVar143,auVar63,auVar92);
                            auVar38._8_8_ = 0;
                            auVar38._0_8_ =
                                 (dVar43 - dVar51) * (local_38.m_data[local_38.m_cols] - dVar59);
                            auVar56._8_8_ = 0;
                            auVar56._0_8_ = dVar31 - dVar59;
                            auVar64._8_8_ = 0;
                            auVar64._0_8_ = local_38.m_data[local_38.m_cols * 2] - dVar51;
                            auVar23 = vfmsub231sd_fma(auVar38,auVar56,auVar64);
                            auVar39._8_8_ = 0;
                            auVar39._0_8_ = zeta1 * auVar23._0_8_;
                            auVar24 = vfmadd231sd_avx512f(auVar39,auVar187,auVar24);
                            pdVar11[uVar20 * 2 + 0x14] = (auVar24._0_8_ * 4.0) / SVar28;
                            dVar31 = local_38.m_data[local_38.m_cols + 1];
                            dVar43 = local_38.m_data[local_38.m_cols * 2 + 1];
                            auVar48._8_8_ = 0;
                            auVar48._0_8_ =
                                 (local_38.m_data[local_38.m_cols * 2 + 2] -
                                 local_38.m_data[local_38.m_cols * 2]) *
                                 (local_38.m_data[local_38.m_cols] - dVar31);
                            auVar65._8_8_ = 0;
                            auVar65._0_8_ =
                                 local_38.m_data[local_38.m_cols] -
                                 local_38.m_data[local_38.m_cols + 2];
                            auVar134._8_8_ = 0;
                            auVar134._0_8_ = dVar43 - local_38.m_data[local_38.m_cols * 2];
                            auVar24 = vfmsub231sd_fma(auVar48,auVar65,auVar134);
                            auVar40._8_8_ = 0;
                            auVar40._0_8_ =
                                 (local_38.m_data[local_38.m_cols * 2 + 3] - dVar43) *
                                 (local_38.m_data[local_38.m_cols + 2] - dVar31);
                            auVar66._8_8_ = 0;
                            auVar66._0_8_ = local_38.m_data[local_38.m_cols + 3] - dVar31;
                            auVar93._8_8_ = 0;
                            auVar93._0_8_ = local_38.m_data[local_38.m_cols * 2 + 2] - dVar43;
                            auVar23 = vfmsub231sd_fma(auVar40,auVar66,auVar93);
                            auVar192._8_8_ = 0;
                            auVar192._0_8_ = zeta4;
                            auVar23 = vmulsd_avx512f(auVar23,auVar192);
                            auVar24 = vfmadd231sd_fma(auVar23,auVar174,auVar24);
                            pdVar11[uVar20 * 2 + 0x17] = (auVar24._0_8_ * 4.0) / SVar28;
                            dVar31 = local_38.m_data[local_38.m_cols];
                            dVar43 = local_38.m_data[local_38.m_cols * 2];
                            dVar51 = local_38.m_data[local_38.m_cols * 2 + 2];
                            dVar59 = local_38.m_data[local_38.m_cols + 2];
                            auVar57._8_8_ = 0;
                            auVar57._0_8_ = dVar31 - dVar59;
                            auVar94._8_8_ = 0;
                            auVar94._0_8_ = local_38.m_data[local_38.m_cols * 2 + 1] - dVar43;
                            auVar118._8_8_ = 0;
                            auVar118._0_8_ =
                                 (dVar51 - dVar43) * (dVar31 - local_38.m_data[local_38.m_cols + 1])
                            ;
                            auVar24 = vfmsub231sd_fma(auVar118,auVar57,auVar94);
                            auVar41._8_8_ = 0;
                            auVar41._0_8_ = dVar59 - dVar31;
                            auVar49._8_8_ = 0;
                            auVar49._0_8_ =
                                 (dVar43 - dVar51) * (dVar59 - local_38.m_data[local_38.m_cols + 3])
                            ;
                            auVar58._8_8_ = 0;
                            auVar58._0_8_ = local_38.m_data[local_38.m_cols * 2 + 3] - dVar51;
                            auVar23 = vfmsub231sd_fma(auVar49,auVar41,auVar58);
                            auVar23 = vmulsd_avx512f(auVar23,auVar192);
                            auVar24 = vfmadd231sd_fma(auVar23,auVar167,auVar24);
                            pdVar11[uVar20 * 2 + 0x1a] = (auVar24._0_8_ * 4.0) / SVar28;
                            if (uVar20 != 0x1d) {
                              dVar31 = local_38.m_data[local_38.m_cols];
                              dVar43 = local_38.m_data[local_38.m_cols * 2];
                              auVar30._8_8_ = 0;
                              auVar30._0_8_ =
                                   local_38.m_data[local_38.m_cols + 1] -
                                   local_38.m_data[local_38.m_cols + 3];
                              auVar50._8_8_ = 0;
                              auVar50._0_8_ =
                                   (local_38.m_data[local_38.m_cols * 2 + 1] -
                                   local_38.m_data[local_38.m_cols * 2 + 3]) *
                                   (dVar31 - local_38.m_data[local_38.m_cols + 3]);
                              auVar135._8_8_ = 0;
                              auVar135._0_8_ = dVar43 - local_38.m_data[local_38.m_cols * 2 + 3];
                              auVar24 = vfmsub231sd_fma(auVar50,auVar135,auVar30);
                              auVar42._8_8_ = 0;
                              auVar42._0_8_ =
                                   (local_38.m_data[local_38.m_cols * 2 + 2] - dVar43) *
                                   (dVar31 - local_38.m_data[local_38.m_cols + 1]);
                              auVar144._8_8_ = 0;
                              auVar144._0_8_ = dVar31 - local_38.m_data[local_38.m_cols + 2];
                              auVar153._8_8_ = 0;
                              auVar153._0_8_ = local_38.m_data[local_38.m_cols * 2 + 1] - dVar43;
                              auVar23 = vfmsub231sd_fma(auVar42,auVar144,auVar153);
                              auVar24 = vmulsd_avx512f(auVar24,auVar192);
                              auVar188._8_8_ = 0;
                              auVar188._0_8_ = zeta3;
                              auVar24 = vfmadd231sd_avx512f(auVar24,auVar188,auVar23);
                              pdVar11[uVar20 * 2 + 0x1d] = (auVar24._0_8_ * 4.0) / SVar28;
                              if (uVar19 != 3) {
                                pdVar11[uVar20 * 3] = pdVar11[uVar20 + 1];
                                pdVar11[uVar20 * 3 + 1] = *pdVar11;
                                pdVar11[uVar20 * 3 + 3] = pdVar11[uVar20 + 4];
                                pdVar11[uVar20 * 3 + 4] = pdVar11[3];
                                pdVar11[uVar20 * 3 + 6] = pdVar11[uVar20 + 7];
                                pdVar11[uVar20 * 3 + 7] = pdVar11[6];
                                pdVar11[uVar20 * 3 + 9] = pdVar11[uVar20 + 10];
                                pdVar11[uVar20 * 3 + 10] = pdVar11[9];
                                pdVar11[uVar20 * 3 + 0xc] = pdVar11[uVar20 + 0xd];
                                pdVar11[uVar20 * 3 + 0xd] = pdVar11[0xc];
                                pdVar11[uVar20 * 3 + 0xf] = pdVar11[uVar20 + 0x10];
                                pdVar11[uVar20 * 3 + 0x10] = pdVar11[0xf];
                                pdVar11[uVar20 * 3 + 0x12] = pdVar11[uVar20 + 0x13];
                                pdVar11[uVar20 * 3 + 0x13] = pdVar11[0x12];
                                pdVar11[uVar20 * 3 + 0x15] = pdVar11[uVar20 + 0x16];
                                pdVar11[uVar20 * 3 + 0x16] = pdVar11[0x15];
                                pdVar11[uVar20 * 3 + 0x18] = pdVar11[uVar20 + 0x19];
                                pdVar11[uVar20 * 3 + 0x19] = pdVar11[0x18];
                                pdVar11[uVar20 * 3 + 0x1b] = pdVar11[uVar20 + 0x1c];
                                pdVar11[uVar20 * 3 + 0x1c] = pdVar11[0x1b];
                                if (4 < uVar19) {
                                  pdVar11[uVar20 * 4 + 1] = pdVar11[uVar20 * 2 + 2];
                                  pdVar11[uVar20 * 4 + 2] = pdVar11[uVar20 + 1];
                                  pdVar11[uVar20 * 4 + 4] = pdVar11[uVar20 * 2 + 5];
                                  pdVar11[uVar20 * 4 + 5] = pdVar11[uVar20 + 4];
                                  pdVar11[uVar20 * 4 + 7] = pdVar11[uVar20 * 2 + 8];
                                  uVar19 = (mmatrB->
                                           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                           ).m_storage.m_rows;
                                  if (((1 < (long)uVar19) &&
                                      (uVar20 = (mmatrB->
                                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                                ).m_storage.m_cols, 7 < (long)uVar20)) &&
                                     ((4 < uVar19 && (uVar20 != 8)))) {
                                    pdVar11 = (mmatrB->
                                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>
                                              ).m_storage.m_data;
                                    pdVar11[uVar20 * 4 + 8] = pdVar11[uVar20 + 7];
                                    if (0xb < uVar20) {
                                      pdVar11[uVar20 * 4 + 10] = pdVar11[uVar20 * 2 + 0xb];
                                      pdVar11[uVar20 * 4 + 0xb] = pdVar11[uVar20 + 10];
                                      if (0xe < uVar20) {
                                        pdVar11[uVar20 * 4 + 0xd] = pdVar11[uVar20 * 2 + 0xe];
                                        pdVar11[uVar20 * 4 + 0xe] = pdVar11[uVar20 + 0xd];
                                        if (0x11 < uVar20) {
                                          pdVar11[uVar20 * 4 + 0x10] = pdVar11[uVar20 * 2 + 0x11];
                                          pdVar11[uVar20 * 4 + 0x11] = pdVar11[uVar20 + 0x10];
                                          if (0x14 < uVar20) {
                                            pdVar11[uVar20 * 4 + 0x13] = pdVar11[uVar20 * 2 + 0x14];
                                            pdVar11[uVar20 * 4 + 0x14] = pdVar11[uVar20 + 0x13];
                                            if (0x17 < uVar20) {
                                              pdVar11[uVar20 * 4 + 0x16] =
                                                   pdVar11[uVar20 * 2 + 0x17];
                                              pdVar11[uVar20 * 4 + 0x17] = pdVar11[uVar20 + 0x16];
                                              if (0x1a < uVar20) {
                                                pdVar11[uVar20 * 4 + 0x19] =
                                                     pdVar11[uVar20 * 2 + 0x1a];
                                                pdVar11[uVar20 * 4 + 0x1a] = pdVar11[uVar20 + 0x19];
                                                if (0x1d < uVar20) {
                                                  pdVar11[uVar20 * 4 + 0x1c] =
                                                       pdVar11[uVar20 * 2 + 0x1d];
                                                  pdVar11[uVar20 * 4 + 0x1d] =
                                                       pdVar11[uVar20 + 0x1c];
                                                  if (5 < uVar19) {
                                                    uVar19 = uVar19 * uVar20;
                                                    uVar21 = uVar19 & 0x7ffffffffffffff8;
                                                    pdVar11[uVar20 * 5] = pdVar11[uVar20 * 2 + 2];
                                                    pdVar11[uVar20 * 5 + 2] = *pdVar11;
                                                    pdVar11[uVar20 * 5 + 3] =
                                                         pdVar11[uVar20 * 2 + 5];
                                                    pdVar11[uVar20 * 5 + 5] = pdVar11[3];
                                                    pdVar11[uVar20 * 5 + 6] =
                                                         pdVar11[uVar20 * 2 + 8];
                                                    pdVar11[uVar20 * 5 + 8] = pdVar11[6];
                                                    pdVar11[uVar20 * 5 + 9] =
                                                         pdVar11[uVar20 * 2 + 0xb];
                                                    pdVar11[uVar20 * 5 + 0xb] = pdVar11[9];
                                                    pdVar11[uVar20 * 5 + 0xc] =
                                                         pdVar11[uVar20 * 2 + 0xe];
                                                    pdVar11[uVar20 * 5 + 0xe] = pdVar11[0xc];
                                                    pdVar11[uVar20 * 5 + 0xf] =
                                                         pdVar11[uVar20 * 2 + 0x11];
                                                    pdVar11[uVar20 * 5 + 0x11] = pdVar11[0xf];
                                                    pdVar11[uVar20 * 5 + 0x12] =
                                                         pdVar11[uVar20 * 2 + 0x14];
                                                    pdVar11[uVar20 * 5 + 0x14] = pdVar11[0x12];
                                                    pdVar11[uVar20 * 5 + 0x15] =
                                                         pdVar11[uVar20 * 2 + 0x17];
                                                    pdVar11[uVar20 * 5 + 0x17] = pdVar11[0x15];
                                                    pdVar11[uVar20 * 5 + 0x18] =
                                                         pdVar11[uVar20 * 2 + 0x1a];
                                                    pdVar11[uVar20 * 5 + 0x1a] = pdVar11[0x18];
                                                    uVar22 = 0;
                                                    pdVar11[uVar20 * 5 + 0x1b] =
                                                         pdVar11[uVar20 * 2 + 0x1d];
                                                    pdVar11[uVar20 * 5 + 0x1d] = pdVar11[0x1b];
                                                    do {
                                                      auVar25 = vaddpd_avx512f(*(undefined1 (*) [64]
                                                                                )(pdVar11 + uVar22),
                                                                               *(undefined1 (*) [64]
                                                                                )(pdVar11 + uVar22))
                                                      ;
                                                      *(undefined1 (*) [64])(pdVar11 + uVar22) =
                                                           auVar25;
                                                      uVar22 = uVar22 + 8;
                                                    } while (uVar22 < uVar21);
                                                    if ((long)uVar21 < (long)uVar19) {
                                                      auVar25 = vpmovsxbq_avx512f(ZEXT816(
                                                  0x706050403020100));
                                                  auVar26 = vpbroadcastq_avx512f();
                                                  uVar20 = 0;
                                                  do {
                                                    auVar27 = vpbroadcastq_avx512f();
                                                    auVar27 = vporq_avx512f(auVar27,auVar25);
                                                    uVar22 = vpcmpuq_avx512f(auVar27,auVar26,2);
                                                    pdVar1 = pdVar11 + uVar21 + uVar20;
                                                    auVar27._8_8_ =
                                                         (ulong)((byte)(uVar22 >> 1) & 1) *
                                                         (long)pdVar1[1];
                                                    auVar27._0_8_ =
                                                         (ulong)((byte)uVar22 & 1) * (long)*pdVar1;
                                                    auVar27._16_8_ =
                                                         (ulong)((byte)(uVar22 >> 2) & 1) *
                                                         (long)pdVar1[2];
                                                    auVar27._24_8_ =
                                                         (ulong)((byte)(uVar22 >> 3) & 1) *
                                                         (long)pdVar1[3];
                                                    auVar27._32_8_ =
                                                         (ulong)((byte)(uVar22 >> 4) & 1) *
                                                         (long)pdVar1[4];
                                                    auVar27._40_8_ =
                                                         (ulong)((byte)(uVar22 >> 5) & 1) *
                                                         (long)pdVar1[5];
                                                    auVar27._48_8_ =
                                                         (ulong)((byte)(uVar22 >> 6) & 1) *
                                                         (long)pdVar1[6];
                                                    auVar27._56_8_ = (uVar22 >> 7) * (long)pdVar1[7]
                                                    ;
                                                    auVar27 = vaddpd_avx512f(auVar27,auVar27);
                                                    pdVar1 = pdVar11 + uVar21 + uVar20;
                                                    bVar12 = (bool)((byte)uVar22 & 1);
                                                    bVar13 = (bool)((byte)(uVar22 >> 1) & 1);
                                                    bVar14 = (bool)((byte)(uVar22 >> 2) & 1);
                                                    bVar15 = (bool)((byte)(uVar22 >> 3) & 1);
                                                    bVar16 = (bool)((byte)(uVar22 >> 4) & 1);
                                                    bVar17 = (bool)((byte)(uVar22 >> 5) & 1);
                                                    bVar18 = (bool)((byte)(uVar22 >> 6) & 1);
                                                    *pdVar1 = (double)((ulong)bVar12 * auVar27._0_8_
                                                                      | (ulong)!bVar12 *
                                                                        (long)*pdVar1);
                                                    pdVar1[1] = (double)((ulong)bVar13 *
                                                                         auVar27._8_8_ |
                                                                        (ulong)!bVar13 *
                                                                        (long)pdVar1[1]);
                                                    pdVar1[2] = (double)((ulong)bVar14 *
                                                                         auVar27._16_8_ |
                                                                        (ulong)!bVar14 *
                                                                        (long)pdVar1[2]);
                                                    pdVar1[3] = (double)((ulong)bVar15 *
                                                                         auVar27._24_8_ |
                                                                        (ulong)!bVar15 *
                                                                        (long)pdVar1[3]);
                                                    pdVar1[4] = (double)((ulong)bVar16 *
                                                                         auVar27._32_8_ |
                                                                        (ulong)!bVar16 *
                                                                        (long)pdVar1[4]);
                                                    pdVar1[5] = (double)((ulong)bVar17 *
                                                                         auVar27._40_8_ |
                                                                        (ulong)!bVar17 *
                                                                        (long)pdVar1[5]);
                                                    pdVar1[6] = (double)((ulong)bVar18 *
                                                                         auVar27._48_8_ |
                                                                        (ulong)!bVar18 *
                                                                        (long)pdVar1[6]);
                                                    pdVar1[7] = (double)((uVar22 >> 7) *
                                                                         auVar27._56_8_ |
                                                                        (ulong)!SUB81(uVar22 >> 7,0)
                                                                        * (long)pdVar1[7]);
                                                    uVar20 = uVar20 + 8;
                                                  } while ((((uint)uVar19 & 7) + 7 & 0xfffffff8) !=
                                                           uVar20);
                                                  }
                                                  if (local_38.m_data != (double *)0x0) {
                                                    free((void *)local_38.m_data[-1]);
                                                  }
                                                  return;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1, 1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1, 1>, Level = 1]"
               );
}

Assistant:

void ChElementTetraCorot_10::ComputeMatrB(ChMatrixDynamic<>& mmatrB,
                                          double zeta1,
                                          double zeta2,
                                          double zeta3,
                                          double zeta4,
                                          double& JacobianDet) {
    ChMatrixDynamic<> Jacobian(4, 4);
    ComputeJacobian(Jacobian, zeta1, zeta2, zeta3, zeta4);

    double Jdet = Jacobian.determinant();
    JacobianDet = Jdet;  // !!! store the Jacobian Determinant: needed for the integration

    mmatrB(0, 0) = (4 * zeta1 - 1) *
                   ((Jacobian(2, 3) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 1)) -
                    (Jacobian(2, 2) - Jacobian(2, 1)) * (Jacobian(3, 3) - Jacobian(3, 1))) /
                   Jdet;
    mmatrB(0, 3) = (4 * zeta2 - 1) *
                   ((Jacobian(2, 2) - Jacobian(2, 0)) * (Jacobian(3, 3) - Jacobian(3, 2)) -
                    (Jacobian(2, 2) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 2))) /
                   Jdet;
    mmatrB(0, 6) = (4 * zeta3 - 1) *
                   ((Jacobian(2, 1) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 3)) -
                    (Jacobian(2, 0) - Jacobian(2, 3)) * (Jacobian(3, 1) - Jacobian(3, 3))) /
                   Jdet;
    mmatrB(0, 9) = (4 * zeta4 - 1) *
                   ((Jacobian(2, 0) - Jacobian(2, 2)) * (Jacobian(3, 1) - Jacobian(3, 0)) -
                    (Jacobian(2, 0) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 0))) /
                   Jdet;
    mmatrB(0, 12) = 4 *
                    (zeta1 * ((Jacobian(2, 2) - Jacobian(2, 0)) * (Jacobian(3, 3) - Jacobian(3, 2)) -
                              (Jacobian(2, 2) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 2))) +
                     zeta2 * ((Jacobian(2, 3) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 1)) -
                              (Jacobian(2, 2) - Jacobian(2, 1)) * (Jacobian(3, 3) - Jacobian(3, 1)))) /
                    Jdet;
    mmatrB(0, 15) = 4 *
                    (zeta2 * ((Jacobian(2, 1) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 3)) -
                              (Jacobian(2, 0) - Jacobian(2, 3)) * (Jacobian(3, 1) - Jacobian(3, 3))) +
                     zeta3 * ((Jacobian(2, 2) - Jacobian(2, 0)) * (Jacobian(3, 3) - Jacobian(3, 2)) -
                              (Jacobian(2, 2) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 2)))) /
                    Jdet;
    mmatrB(0, 18) = 4 *
                    (zeta3 * ((Jacobian(2, 3) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 1)) -
                              (Jacobian(2, 2) - Jacobian(2, 1)) * (Jacobian(3, 3) - Jacobian(3, 1))) +
                     zeta1 * ((Jacobian(2, 1) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 3)) -
                              (Jacobian(2, 0) - Jacobian(2, 3)) * (Jacobian(3, 1) - Jacobian(3, 3)))) /
                    Jdet;
    mmatrB(0, 21) = 4 *
                    (zeta1 * ((Jacobian(2, 0) - Jacobian(2, 2)) * (Jacobian(3, 1) - Jacobian(3, 0)) -
                              (Jacobian(2, 0) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 0))) +
                     zeta4 * ((Jacobian(2, 3) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 1)) -
                              (Jacobian(2, 2) - Jacobian(2, 1)) * (Jacobian(3, 3) - Jacobian(3, 1)))) /
                    Jdet;
    mmatrB(0, 24) = 4 *
                    (zeta2 * ((Jacobian(2, 0) - Jacobian(2, 2)) * (Jacobian(3, 1) - Jacobian(3, 0)) -
                              (Jacobian(2, 0) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 0))) +
                     zeta4 * ((Jacobian(2, 2) - Jacobian(2, 0)) * (Jacobian(3, 3) - Jacobian(3, 2)) -
                              (Jacobian(2, 2) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 2)))) /
                    Jdet;
    mmatrB(0, 27) = 4 *
                    (zeta3 * ((Jacobian(2, 0) - Jacobian(2, 2)) * (Jacobian(3, 1) - Jacobian(3, 0)) -
                              (Jacobian(2, 0) - Jacobian(2, 1)) * (Jacobian(3, 2) - Jacobian(3, 0))) +
                     zeta4 * ((Jacobian(2, 1) - Jacobian(2, 3)) * (Jacobian(3, 0) - Jacobian(3, 3)) -
                              (Jacobian(2, 0) - Jacobian(2, 3)) * (Jacobian(3, 1) - Jacobian(3, 3)))) /
                    Jdet;

    mmatrB(1, 1) = (4 * zeta1 - 1) *
                   ((Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(3, 3) - Jacobian(3, 1)) -
                    (Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(3, 2) - Jacobian(3, 1))) /
                   Jdet;
    mmatrB(1, 4) = (4 * zeta2 - 1) *
                   ((Jacobian(1, 3) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 0)) -
                    (Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 3))) /
                   Jdet;
    mmatrB(1, 7) = (4 * zeta3 - 1) *
                   ((Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(3, 1) - Jacobian(3, 3)) -
                    (Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(3, 0) - Jacobian(3, 3))) /
                   Jdet;
    mmatrB(1, 10) = (4 * zeta4 - 1) *
                    ((Jacobian(1, 1) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 2)) -
                     (Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 1))) /
                    Jdet;
    mmatrB(1, 13) = 4 *
                    (zeta1 * ((Jacobian(1, 3) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 0)) -
                              (Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 3))) +
                     zeta2 * ((Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(3, 3) - Jacobian(3, 1)) -
                              (Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(3, 2) - Jacobian(3, 1)))) /
                    Jdet;
    mmatrB(1, 16) = 4 *
                    (zeta2 * ((Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(3, 1) - Jacobian(3, 3)) -
                              (Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(3, 0) - Jacobian(3, 3))) +
                     zeta3 * ((Jacobian(1, 3) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 0)) -
                              (Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 3)))) /
                    Jdet;
    mmatrB(1, 19) = 4 *
                    (zeta3 * ((Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(3, 3) - Jacobian(3, 1)) -
                              (Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(3, 2) - Jacobian(3, 1))) +
                     zeta1 * ((Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(3, 1) - Jacobian(3, 3)) -
                              (Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(3, 0) - Jacobian(3, 3)))) /
                    Jdet;
    mmatrB(1, 22) = 4 *
                    (zeta1 * ((Jacobian(1, 1) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 2)) -
                              (Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 1))) +
                     zeta4 * ((Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(3, 3) - Jacobian(3, 1)) -
                              (Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(3, 2) - Jacobian(3, 1)))) /
                    Jdet;
    mmatrB(1, 25) = 4 *
                    (zeta2 * ((Jacobian(1, 1) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 2)) -
                              (Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 1))) +
                     zeta4 * ((Jacobian(1, 3) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 0)) -
                              (Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(3, 2) - Jacobian(3, 3)))) /
                    Jdet;
    mmatrB(1, 28) = 4 *
                    (zeta3 * ((Jacobian(1, 1) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 2)) -
                              (Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(3, 0) - Jacobian(3, 1))) +
                     zeta4 * ((Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(3, 1) - Jacobian(3, 3)) -
                              (Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(3, 0) - Jacobian(3, 3)))) /
                    Jdet;

    mmatrB(2, 2) = (4 * zeta1 - 1) *
                   ((Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 1)) -
                    (Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(2, 3) - Jacobian(2, 1))) /
                   Jdet;
    mmatrB(2, 5) = (4 * zeta2 - 1) *
                   ((Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(2, 3) - Jacobian(2, 2)) -
                    (Jacobian(1, 2) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 2))) /
                   Jdet;
    mmatrB(2, 8) = (4 * zeta3 - 1) *
                   ((Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 3)) -
                    (Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(2, 1) - Jacobian(2, 3))) /
                   Jdet;
    mmatrB(2, 11) = (4 * zeta4 - 1) *
                    ((Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(2, 1) - Jacobian(2, 0)) -
                     (Jacobian(1, 0) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 0))) /
                    Jdet;
    mmatrB(2, 14) = 4 *
                    (zeta1 * ((Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(2, 3) - Jacobian(2, 2)) -
                              (Jacobian(1, 2) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 2))) +
                     zeta2 * ((Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 1)) -
                              (Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(2, 3) - Jacobian(2, 1)))) /
                    Jdet;
    mmatrB(2, 17) = 4 *
                    (zeta2 * ((Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 3)) -
                              (Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(2, 1) - Jacobian(2, 3))) +
                     zeta3 * ((Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(2, 3) - Jacobian(2, 2)) -
                              (Jacobian(1, 2) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 2)))) /
                    Jdet;
    mmatrB(2, 20) = 4 *
                    (zeta3 * ((Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 1)) -
                              (Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(2, 3) - Jacobian(2, 1))) +
                     zeta1 * ((Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 3)) -
                              (Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(2, 1) - Jacobian(2, 3)))) /
                    Jdet;
    mmatrB(2, 23) = 4 *
                    (zeta1 * ((Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(2, 1) - Jacobian(2, 0)) -
                              (Jacobian(1, 0) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 0))) +
                     zeta4 * ((Jacobian(1, 3) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 1)) -
                              (Jacobian(1, 2) - Jacobian(1, 1)) * (Jacobian(2, 3) - Jacobian(2, 1)))) /
                    Jdet;
    mmatrB(2, 26) = 4 *
                    (zeta2 * ((Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(2, 1) - Jacobian(2, 0)) -
                              (Jacobian(1, 0) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 0))) +
                     zeta4 * ((Jacobian(1, 2) - Jacobian(1, 0)) * (Jacobian(2, 3) - Jacobian(2, 2)) -
                              (Jacobian(1, 2) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 2)))) /
                    Jdet;
    mmatrB(2, 29) = 4 *
                    (zeta3 * ((Jacobian(1, 0) - Jacobian(1, 2)) * (Jacobian(2, 1) - Jacobian(2, 0)) -
                              (Jacobian(1, 0) - Jacobian(1, 1)) * (Jacobian(2, 2) - Jacobian(2, 0))) +
                     zeta4 * ((Jacobian(1, 1) - Jacobian(1, 3)) * (Jacobian(2, 0) - Jacobian(2, 3)) -
                              (Jacobian(1, 0) - Jacobian(1, 3)) * (Jacobian(2, 1) - Jacobian(2, 3)))) /
                    Jdet;

    mmatrB(3, 0) = mmatrB(1, 1);
    mmatrB(3, 1) = mmatrB(0, 0);
    mmatrB(3, 3) = mmatrB(1, 4);
    mmatrB(3, 4) = mmatrB(0, 3);
    mmatrB(3, 6) = mmatrB(1, 7);
    mmatrB(3, 7) = mmatrB(0, 6);
    mmatrB(3, 9) = mmatrB(1, 10);
    mmatrB(3, 10) = mmatrB(0, 9);
    mmatrB(3, 12) = mmatrB(1, 13);
    mmatrB(3, 13) = mmatrB(0, 12);
    mmatrB(3, 15) = mmatrB(1, 16);
    mmatrB(3, 16) = mmatrB(0, 15);
    mmatrB(3, 18) = mmatrB(1, 19);
    mmatrB(3, 19) = mmatrB(0, 18);
    mmatrB(3, 21) = mmatrB(1, 22);
    mmatrB(3, 22) = mmatrB(0, 21);
    mmatrB(3, 24) = mmatrB(1, 25);
    mmatrB(3, 25) = mmatrB(0, 24);
    mmatrB(3, 27) = mmatrB(1, 28);
    mmatrB(3, 28) = mmatrB(0, 27);

    mmatrB(4, 1) = mmatrB(2, 2);
    mmatrB(4, 2) = mmatrB(1, 1);
    mmatrB(4, 4) = mmatrB(2, 5);
    mmatrB(4, 5) = mmatrB(1, 4);
    mmatrB(4, 7) = mmatrB(2, 8);
    mmatrB(4, 8) = mmatrB(1, 7);
    mmatrB(4, 10) = mmatrB(2, 11);
    mmatrB(4, 11) = mmatrB(1, 10);
    mmatrB(4, 13) = mmatrB(2, 14);
    mmatrB(4, 14) = mmatrB(1, 13);
    mmatrB(4, 16) = mmatrB(2, 17);
    mmatrB(4, 17) = mmatrB(1, 16);
    mmatrB(4, 19) = mmatrB(2, 20);
    mmatrB(4, 20) = mmatrB(1, 19);
    mmatrB(4, 22) = mmatrB(2, 23);
    mmatrB(4, 23) = mmatrB(1, 22);
    mmatrB(4, 25) = mmatrB(2, 26);
    mmatrB(4, 26) = mmatrB(1, 25);
    mmatrB(4, 28) = mmatrB(2, 29);
    mmatrB(4, 29) = mmatrB(1, 28);

    mmatrB(5, 0) = mmatrB(2, 2);
    mmatrB(5, 2) = mmatrB(0, 0);
    mmatrB(5, 3) = mmatrB(2, 5);
    mmatrB(5, 5) = mmatrB(0, 3);
    mmatrB(5, 6) = mmatrB(2, 8);
    mmatrB(5, 8) = mmatrB(0, 6);
    mmatrB(5, 9) = mmatrB(2, 11);
    mmatrB(5, 11) = mmatrB(0, 9);
    mmatrB(5, 12) = mmatrB(2, 14);
    mmatrB(5, 14) = mmatrB(0, 12);
    mmatrB(5, 15) = mmatrB(2, 17);
    mmatrB(5, 17) = mmatrB(0, 15);
    mmatrB(5, 18) = mmatrB(2, 20);
    mmatrB(5, 20) = mmatrB(0, 18);
    mmatrB(5, 21) = mmatrB(2, 23);
    mmatrB(5, 23) = mmatrB(0, 21);
    mmatrB(5, 24) = mmatrB(2, 26);
    mmatrB(5, 26) = mmatrB(0, 24);
    mmatrB(5, 27) = mmatrB(2, 29);
    mmatrB(5, 29) = mmatrB(0, 27);

    mmatrB *= 2;
}